

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

TPZTransform<double> * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::GetTransform
          (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this,int side,int son)

{
  bool bVar1;
  long *in_RSI;
  TPZRefPattern *in_RDI;
  TPZTransform<double> trf;
  TPZRefPattern *this_00;
  undefined7 in_stack_fffffffffffffe28;
  TPZAutoPointer<TPZRefPattern> in_stack_fffffffffffffe30;
  
  this_00 = in_RDI;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)in_stack_fffffffffffffe30.fRef);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RSI + 0x4b));
  if (bVar1) {
    (**(code **)(*in_RSI + 0x2b0))(&stack0xfffffffffffffe30);
    TPZAutoPointer<TPZRefPattern>::operator->
              ((TPZAutoPointer<TPZRefPattern> *)&stack0xfffffffffffffe30);
    TPZRefPattern::Transform(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)in_RDI);
  }
  else {
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)in_stack_fffffffffffffe30.fRef,
               (TPZTransform<double> *)CONCAT17(bVar1,in_stack_fffffffffffffe28));
  }
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x15f5ad9);
  return (TPZTransform<double> *)this_00;
}

Assistant:

TPZTransform<> TPZGeoElRefPattern<TGeo>::GetTransform(int side,int son){
	TPZTransform<> trf;
	if(!fRefPattern) return trf;
	return this->GetRefPattern()->Transform(side,son);
}